

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O3

void vera::computeSmoothingNormals
               (attrib_t *_attrib,shape_t *_shape,
               map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
               *smoothVertexNormals)

{
  _Rb_tree_header *p_Var1;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar2;
  float fVar3;
  int iVar4;
  pointer pfVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  pointer paVar9;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar10;
  long lVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  size_t i_1;
  float fVar14;
  float fVar15;
  float fVar16;
  vec3 normal;
  int vi [3];
  vec3 v [3];
  vec3 local_78;
  int local_6c [3];
  attrib_t *local_60;
  vec3 local_58;
  vec3 local_4c;
  vec3 local_40;
  
  local_60 = _attrib;
  std::
  _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  ::clear(&smoothVertexNormals->_M_t);
  paVar9 = (_shape->mesh).indices.
           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (2 < (ulong)(((long)(_shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 2) *
                 -0x5555555555555555)) {
    p_Var1 = &(smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header;
    uVar13 = 0;
    do {
      local_6c[0] = paVar9[uVar13 * 3].vertex_index;
      local_6c[1] = paVar9[uVar13 * 3 + 1].vertex_index;
      local_6c[2] = paVar9[uVar13 * 3 + 2].vertex_index;
      pfVar5 = (local_60->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar10 = &local_58.field_2;
      lVar11 = 0;
      do {
        aVar2 = *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                 (pfVar5 + (long)local_6c[lVar11] * 3 + 2);
        *(undefined8 *)(paVar10 + -2) = *(undefined8 *)(pfVar5 + (long)local_6c[lVar11] * 3);
        *paVar10 = aVar2;
        lVar11 = lVar11 + 1;
        paVar10 = paVar10 + 3;
      } while (lVar11 != 3);
      calcNormal(&local_58,&local_4c,&local_40,&local_78);
      lVar11 = 0;
      do {
        p_Var12 = (smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var12 == (_Base_ptr)0x0) {
LAB_002a50f6:
          pmVar7 = std::
                   map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                   ::operator[](smoothVertexNormals,local_6c + lVar11);
          pmVar7->field_0 = local_78.field_0;
          pmVar7->field_1 = local_78.field_1;
          (pmVar7->field_2).z = (float)local_78.field_2;
        }
        else {
          iVar4 = local_6c[lVar11];
          p_Var6 = &p_Var1->_M_header;
          do {
            if (iVar4 <= (int)p_Var12[1]._M_color) {
              p_Var6 = p_Var12;
            }
            p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < iVar4];
          } while (p_Var12 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var6 == p_Var1) || (iVar4 < (int)p_Var6[1]._M_color))
          goto LAB_002a50f6;
          *(ulong *)&p_Var6[1].field_0x4 =
               CONCAT44((float)((ulong)*(undefined8 *)&p_Var6[1].field_0x4 >> 0x20) +
                        local_78.field_1.y,
                        (float)*(undefined8 *)&p_Var6[1].field_0x4 + local_78.field_0.x);
          *(float *)((long)&p_Var6[1]._M_parent + 4) =
               local_78.field_2.z + *(float *)((long)&p_Var6[1]._M_parent + 4);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      paVar9 = (_shape->mesh).indices.
               super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)(((long)(_shape->mesh).indices.
                                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 2)
                             * -0x5555555555555555) / 3);
  }
  for (p_Var8 = (smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    fVar3 = *(float *)((long)&p_Var8[1]._M_parent + 4);
    fVar14 = (float)*(undefined8 *)&p_Var8[1].field_0x4;
    fVar15 = (float)((ulong)*(undefined8 *)&p_Var8[1].field_0x4 >> 0x20);
    fVar16 = 1.0 / SQRT(fVar15 * fVar15 + fVar14 * fVar14 + fVar3 * fVar3);
    *(ulong *)&p_Var8[1].field_0x4 = CONCAT44(fVar16 * fVar15,fVar16 * fVar14);
    *(float *)((long)&p_Var8[1]._M_parent + 4) = fVar3 * fVar16;
  }
  return;
}

Assistant:

void computeSmoothingNormals(const tinyobj::attrib_t& _attrib, const tinyobj::shape_t& _shape, std::map<int, glm::vec3>& smoothVertexNormals) {
    smoothVertexNormals.clear();

    std::map<int, glm::vec3>::iterator iter;

    for (size_t f = 0; f < _shape.mesh.indices.size() / 3; f++) {
        // Get the three indexes of the face (all faces are triangular)
        tinyobj::index_t idx0 = _shape.mesh.indices[3 * f + 0];
        tinyobj::index_t idx1 = _shape.mesh.indices[3 * f + 1];
        tinyobj::index_t idx2 = _shape.mesh.indices[3 * f + 2];

        // Get the three vertex indexes and coordinates
        int vi[3];      // indexes
        vi[0] = idx0.vertex_index;
        vi[1] = idx1.vertex_index;
        vi[2] = idx2.vertex_index;

        glm::vec3 v[3];  // coordinates
        for (size_t i = 0; i < 3; i++)
            v[i] = getVertex(_attrib, vi[i]);

        // Compute the normal of the face
        glm::vec3 normal;
        calcNormal(v[0], v[1], v[2], normal);

        // Add the normal to the three vertexes
        for (size_t i = 0; i < 3; ++i) {
            iter = smoothVertexNormals.find(vi[i]);
            // add
            if (iter != smoothVertexNormals.end())
                iter->second += normal;
            else
                smoothVertexNormals[vi[i]] = normal;
        }
    }  // f

    // Normalize the normals, that is, make them unit vectors
    for (iter = smoothVertexNormals.begin(); iter != smoothVertexNormals.end(); iter++) {
        iter->second = glm::normalize(iter->second);
    }
}